

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

int FIX::socket_bind(socket_handle socket,char *hostname,int port)

{
  int iVar1;
  sockaddr local_18;
  
  local_18.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_18.sa_family = 2;
  local_18.sa_data._2_4_ = 0;
  if ((hostname != (char *)0x0) && (local_18.sa_data._2_4_ = 0, *hostname != '\0')) {
    local_18.sa_data._2_4_ = inet_addr(hostname);
  }
  iVar1 = bind(socket,&local_18,0x10);
  return iVar1;
}

Assistant:

int socket_bind(socket_handle socket, const char *hostname, int port) {
  sockaddr_in address;
  socklen_t socklen;

  address.sin_family = PF_INET;
  address.sin_port = htons(port);
  if (!hostname || !*hostname) {
    address.sin_addr.s_addr = INADDR_ANY;
  } else {
    address.sin_addr.s_addr = inet_addr(hostname);
  }
  socklen = sizeof(address);

  return bind(socket, reinterpret_cast<sockaddr *>(&address), socklen);
}